

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_4::ValidateDecorateId(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *this;
  DiagnosticStream local_200;
  Decoration local_24;
  Instruction *pIStack_20;
  Decoration decoration;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = val::Instruction::GetOperandAs<spv::Decoration>(inst,1);
  bVar1 = DecorationTakesIdParameters(local_24);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    this = DiagnosticStream::operator<<
                     (&local_200,
                      (char (*) [76])
                      "Decorations that don\'t take ID parameters may not be used with OpDecorateId"
                     );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateDecorateId(ValidationState_t& _, const Instruction* inst) {
  const auto decoration = inst->GetOperandAs<spv::Decoration>(1);
  if (!DecorationTakesIdParameters(decoration)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Decorations that don't take ID parameters may not be used with "
              "OpDecorateId";
  }

  // No member decorations take id parameters, so we don't bother checking if
  // we are using a member only decoration here.

  // TODO: Add validations for these decorations.
  // UniformId is covered elsewhere.
  return SPV_SUCCESS;
}